

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::ConfidentialTransactionContext::IsFindUtxoMap
          (ConfidentialTransactionContext *this,OutPoint *outpoint,UtxoData *utxo)

{
  bool bVar1;
  uint32_t uVar2;
  Txid *this_00;
  long in_RDX;
  OutPoint *in_RSI;
  long in_RDI;
  UtxoData *utxo_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range1;
  UtxoData *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  byte local_75;
  Txid local_60;
  reference local_40;
  UtxoData *local_38;
  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_30;
  long local_28;
  long local_20;
  OutPoint *local_18;
  
  local_28 = in_RDI + 0x40;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30._M_current =
       (UtxoData *)
       std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin(in_stack_ffffffffffffff68);
  local_38 = (UtxoData *)
             std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
                       ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                        in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      return false;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
               ::operator*(&local_30);
    uVar2 = core::OutPoint::GetVout(local_18);
    local_75 = 0;
    in_stack_ffffffffffffff77 = local_75;
    if (uVar2 == local_40->vout) {
      this_00 = &local_40->txid;
      core::OutPoint::GetTxid(&local_60,local_18);
      in_stack_ffffffffffffff77 = core::Txid::Equals(this_00,&local_60);
      core::Txid::~Txid((Txid *)0x55475c);
    }
    if ((in_stack_ffffffffffffff77 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
    ::operator++(&local_30);
  }
  if (local_20 != 0) {
    UtxoData::operator=((UtxoData *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
  }
  return true;
}

Assistant:

bool ConfidentialTransactionContext::IsFindUtxoMap(
    const OutPoint& outpoint, UtxoData* utxo) const {
  for (const auto& utxo_data : utxo_map_) {
    if ((outpoint.GetVout() == utxo_data.vout) &&
        utxo_data.txid.Equals(outpoint.GetTxid())) {
      if (utxo != nullptr) *utxo = utxo_data;
      return true;
    }
  }
  return false;
}